

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void IsoWriter::writeIcbTag(bool namedStream,uint8_t *buffer,FileTypes fileType)

{
  uint16_t *buff16;
  uint32_t *buff32;
  FileTypes fileType_local;
  uint8_t *buffer_local;
  bool namedStream_local;
  
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\x04';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\x01';
  buffer[9] = '\0';
  buffer[0xb] = (uint8_t)fileType;
  if ((fileType == File) || (fileType == RealtimeFile)) {
    buffer[0x12] = '!';
    buffer[0x13] = '\0';
  }
  else {
    buffer[0x12] = ' ';
    buffer[0x13] = '\0';
  }
  if (namedStream) {
    *(short *)(buffer + 0x12) = *(short *)(buffer + 0x12) + 0x2000;
  }
  return;
}

Assistant:

void IsoWriter::writeIcbTag(const bool namedStream, uint8_t *buffer, FileTypes fileType)
{
    const auto buff32 = reinterpret_cast<uint32_t *>(buffer);
    const auto buff16 = reinterpret_cast<uint16_t *>(buffer);

    // icb tag
    buff32[0] = 0;  // Prior Recorded Number of Direct Entries
    buff16[2] = 4;  // Strategy Type
    buff16[3] = 0;  // Strategy parameters
    buff16[4] = 1;  // Maximum Number of Entries
    // skip reserved byte
    buffer[11] = static_cast<uint8_t>(fileType);  // metadata file type
    // skip 6 byte zero Parent ICB Location
    if (fileType == FileTypes::File || fileType == FileTypes::RealtimeFile)
        buff16[18 / 2] = 0x0021;  // flags: archive + long AD
    else
        buff16[18 / 2] = 0x0020;  // flags: archive
    if (namedStream)
        buff16[18 / 2] += 0x2000;  // flags: stream
}